

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u16(CBS *cbs,uint16_t *out)

{
  ushort uVar1;
  ulong uVar2;
  ushort *puVar3;
  
  uVar2 = cbs->len;
  if (1 < uVar2) {
    puVar3 = (ushort *)cbs->data;
    cbs->data = (uint8_t *)(puVar3 + 1);
    cbs->len = uVar2 - 2;
    uVar1 = *puVar3;
    *out = uVar1 << 8 | uVar1 >> 8;
  }
  return (uint)(1 < uVar2);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}